

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O3

void __thiscall
Projection::rescaleVar(Projection *this,MultiFab *sig,int param_2,MultiFab *vel,int level)

{
  int iVar1;
  int iVar2;
  pointer pGVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int i;
  uint uVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int iVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  MFIter mfi;
  Box local_114;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  Array4<double> local_d0;
  MFIter local_90;
  long lVar17;
  
  pGVar3 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = *(int *)((long)(pGVar3 + level) + 0xac);
  iVar1 = *(int *)((long)(pGVar3 + level) + 0xb0);
  iVar21 = *(int *)((long)(pGVar3 + level) + 0xb8);
  iVar2 = *(int *)((long)(pGVar3 + level) + 0xbc);
  amrex::MFIter::MFIter(&local_90,(FabArrayBase *)sig,true);
  if (local_90.currentIndex < local_90.endIndex) {
    auVar13._0_8_ = (long)iVar5;
    auVar13._8_4_ = iVar5;
    auVar13._12_4_ = iVar5 >> 0x1f;
    auVar11._0_8_ = (long)iVar21;
    auVar11._8_4_ = iVar21;
    auVar11._12_4_ = iVar21 >> 0x1f;
    local_e8 = auVar13 ^ _DAT_0075db50;
    local_f8 = auVar11 ^ _DAT_0075db50;
    do {
      amrex::MFIter::growntilebox(&local_114,&local_90,-1000000);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&sig->super_FabArray<amrex::FArrayBox>,&local_90);
      auVar13 = _DAT_0074fb40;
      auVar11 = _DAT_0074fb30;
      if (local_114.smallend.vect[2] <= local_114.bigend.vect[2]) {
        uVar8 = local_114.bigend.vect[0] - local_114.smallend.vect[0];
        auVar19._0_8_ = (long)local_114.smallend.vect[0];
        auVar19._8_4_ = local_114.smallend.vect[0];
        auVar19._12_4_ = local_114.smallend.vect[0] >> 0x1f;
        auVar12._0_8_ = auVar19._0_8_ + (long)DAT_0074fb30;
        auVar12._8_8_ = auVar19._8_8_ + DAT_0074fb30._8_8_;
        auVar14._4_4_ = 0;
        auVar14._0_4_ = uVar8;
        auVar14._8_4_ = uVar8;
        auVar14._12_4_ = 0;
        auVar14 = auVar14 ^ _DAT_0074fb40;
        iVar5 = local_114.smallend.vect[2];
        do {
          if (local_114.smallend.vect[1] <= local_114.bigend.vect[1]) {
            lVar9 = (long)local_d0.p +
                    ((long)iVar5 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                    ((long)local_114.smallend.vect[1] - (long)local_d0.begin.y) *
                    local_d0.jstride * 8 + (long)local_114.smallend.vect[0] * 8 +
                    (long)local_d0.begin.x * -8 + 8;
            lVar7 = (long)local_114.smallend.vect[1];
            do {
              if (local_114.smallend.vect[0] <= local_114.bigend.vect[0]) {
                bVar4 = iVar2 < lVar7;
                bVar10 = lVar7 < iVar1;
                auVar15._9_7_ = 0;
                auVar15._0_9_ = CONCAT18(bVar4,(ulong)bVar4) | CONCAT18(bVar10,(ulong)bVar10);
                uVar6 = 0;
                auVar16 = auVar12;
                do {
                  auVar27._8_4_ = (int)uVar6;
                  auVar27._0_8_ = uVar6;
                  auVar27._12_4_ = (int)(uVar6 >> 0x20);
                  auVar19 = (auVar27 | auVar11) ^ auVar13;
                  auVar18._0_4_ = -(uint)(auVar14._0_4_ < auVar19._0_4_);
                  auVar18._4_4_ = -(uint)(auVar14._4_4_ < auVar19._4_4_);
                  auVar18._8_4_ = -(uint)(auVar14._8_4_ < auVar19._8_4_);
                  auVar18._12_4_ = -(uint)(auVar14._12_4_ < auVar19._12_4_);
                  auVar34._4_4_ = auVar18._0_4_;
                  auVar34._0_4_ = auVar18._0_4_;
                  auVar34._8_4_ = auVar18._8_4_;
                  auVar34._12_4_ = auVar18._8_4_;
                  auVar20._4_4_ = -(uint)(auVar19._4_4_ == auVar14._4_4_);
                  auVar20._12_4_ = -(uint)(auVar19._12_4_ == auVar14._12_4_);
                  auVar20._0_4_ = auVar20._4_4_;
                  auVar20._8_4_ = auVar20._12_4_;
                  auVar19 = auVar16 ^ _DAT_0075db50;
                  iVar25 = -(uint)(auVar19._0_4_ < (int)local_e8._0_4_);
                  iVar21 = auVar19._4_4_;
                  iVar28 = -(uint)(auVar19._8_4_ < (int)local_e8._8_4_);
                  iVar23 = auVar19._12_4_;
                  auVar29._4_4_ = iVar25;
                  auVar29._0_4_ = iVar25;
                  auVar29._8_4_ = iVar28;
                  auVar29._12_4_ = iVar28;
                  auVar32._4_4_ = -(uint)(local_e8._4_4_ == iVar21);
                  auVar32._12_4_ = -(uint)(local_e8._12_4_ == iVar23);
                  auVar32._0_4_ = auVar32._4_4_;
                  auVar32._8_4_ = auVar32._12_4_;
                  auVar30._4_4_ = -(uint)(iVar21 < (int)local_e8._4_4_);
                  auVar30._0_4_ = -(uint)(iVar21 < (int)local_e8._4_4_);
                  auVar30._8_4_ = -(uint)(iVar23 < (int)local_e8._12_4_);
                  auVar30._12_4_ = -(uint)(iVar23 < (int)local_e8._12_4_);
                  auVar31 = auVar30 | auVar32 & auVar29;
                  iVar25 = -(uint)((int)local_f8._0_4_ < auVar19._0_4_);
                  auVar26._4_4_ = -(uint)((int)local_f8._4_4_ < iVar21);
                  iVar28 = -(uint)((int)local_f8._8_4_ < auVar19._8_4_);
                  auVar26._12_4_ = -(uint)((int)local_f8._12_4_ < iVar23);
                  auVar33._4_4_ = iVar25;
                  auVar33._0_4_ = iVar25;
                  auVar33._8_4_ = iVar28;
                  auVar33._12_4_ = iVar28;
                  auVar35._4_4_ = -(uint)(iVar21 == local_f8._4_4_);
                  auVar35._0_4_ = -(uint)(iVar21 == local_f8._4_4_);
                  auVar35._8_4_ = -(uint)(iVar23 == local_f8._12_4_);
                  auVar35._12_4_ = -(uint)(iVar23 == local_f8._12_4_);
                  auVar24._4_4_ = auVar18._4_4_;
                  auVar24._0_4_ = auVar18._4_4_;
                  auVar24._8_4_ = auVar18._12_4_;
                  auVar24._12_4_ = auVar18._12_4_;
                  auVar19 = auVar34 & auVar20 | auVar24;
                  auVar26._0_4_ = auVar26._4_4_;
                  auVar26._8_4_ = auVar26._12_4_;
                  auVar27 = auVar26 | auVar35 & auVar33 | auVar31 | auVar15;
                  auVar34 = (auVar19 | auVar27) ^ _DAT_00757340;
                  if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = *(ulong *)(lVar9 + -8 + uVar6 * 8);
                  }
                  if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    auVar31._8_8_ = *(undefined8 *)(lVar9 + uVar6 * 8);
                  }
                  auVar34 = divpd(_DAT_00753000,auVar31);
                  auVar36._0_8_ = -(ulong)(1e-200 < ABS(auVar31._0_8_)) & auVar34._0_8_;
                  auVar36._8_8_ = -(ulong)(1e-200 < ABS(auVar31._8_8_)) & auVar34._8_8_;
                  auVar27 = ~auVar19 & auVar27;
                  iVar21 = auVar27._0_4_;
                  iVar23 = auVar27._8_4_;
                  auVar22._0_4_ = (iVar21 << 0x1f) >> 0x1f;
                  auVar22._4_4_ = (iVar21 << 0x1f) >> 0x1f;
                  auVar22._8_4_ = (iVar23 << 0x1f) >> 0x1f;
                  auVar22._12_4_ = (iVar23 << 0x1f) >> 0x1f;
                  auVar27 = auVar22 & _DAT_00760490 | ~auVar22 & auVar36;
                  if ((~auVar19._0_4_ & 1) != 0) {
                    *(long *)(lVar9 + -8 + uVar6 * 8) = auVar27._0_8_;
                  }
                  if ((((auVar20 & auVar18 | auVar24) ^ _DAT_00757340) & (undefined1  [16])0x1) !=
                      (undefined1  [16])0x0) {
                    *(long *)(lVar9 + uVar6 * 8) = auVar27._8_8_;
                  }
                  uVar6 = uVar6 + 2;
                  lVar17 = auVar16._8_8_;
                  auVar16._0_8_ = auVar16._0_8_ + 2;
                  auVar16._8_8_ = lVar17 + 2;
                } while (((ulong)uVar8 + 2 & 0xfffffffffffffffe) != uVar6);
              }
              lVar7 = lVar7 + 1;
              lVar9 = lVar9 + local_d0.jstride * 8;
            } while (local_114.bigend.vect[1] + 1 != (int)lVar7);
          }
          bVar10 = iVar5 != local_114.bigend.vect[2];
          iVar5 = iVar5 + 1;
        } while (bVar10);
      }
      amrex::MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
Projection::rescaleVar (MultiFab*       sig,
                        int             /*sig_nghosts*/,
                        MultiFab*       vel,
                        int             level)
{
    AMREX_ASSERT(sig->nComp() == 1);
    AMREX_ASSERT(vel->nComp() >= AMREX_SPACEDIM);

    const Box& domain  = parent->Geom(level).Domain();
    const int  domlox  = domain.smallEnd(0);
    const int  domloy  = domain.smallEnd(1);
    const int  domhix  = domain.bigEnd(0);
    const int  domhiy  = domain.bigEnd(1);

#if (AMREX_SPACEDIM  == 2)

    if (parent->Geom(0).IsRZ())
    {
        //
        // Divide sigma and vel by a radius for r-z coordinates.
        // Invert sigma to return to original form
        //
	const Real dxr     = parent->Geom(level).CellSize()[0];

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
	for (MFIter mfi(*sig,TilingIfNotGPU()); mfi.isValid(); ++mfi)
	{
	  const Box& bx = mfi.growntilebox();
	  auto const& sigarr = sig->array(mfi);

	  amrex::ParallelFor(bx, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      // Don't think we need this check for small sigma since RZ
	      // doesn't work with EB in MLNodeLap. The concern is covered vals == 0
	      // if ( amrex::Math::abs(sigarr(i,j,k)) > SmallValue ) ?
	      sigarr(i,j,k) = (static_cast<Real>(i)+ Real(0.5))*dxr/sigarr(i,j,k);
	      // : sigarr(i,j,k) = 0.;
	    }
	    else
	    {
	      // set vals outside the domain to bogus_value
	      sigarr(i,j,k) = BogusValue;
	    }
	  });

	  auto const& velarr = vel->array(mfi);

	  amrex::ParallelFor(bx, AMREX_SPACEDIM, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      velarr(i,j,k,n) /= (static_cast<Real>(i)+ Real(0.5))*dxr;
	    }
	    else
	    {
	      // set vals outside the domain
	      velarr(i,j,k,n) = BogusValue;
	    }
	  });
	}
    }
    else
#endif
    {
        //
        // Invert sigma
        //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
	for (MFIter mfi(*sig,TilingIfNotGPU()); mfi.isValid(); ++mfi)
	{
	  const Box& bx = mfi.growntilebox();
	  auto const& sigarr = sig->array(mfi);

	  amrex::ParallelFor(bx, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      // The conern here is EB covered cells set to zero
	      sigarr(i,j,k) = ( amrex::Math::abs(sigarr(i,j,k)) > SmallValue )
		? Real(1.0)/sigarr(i,j,k)
		: sigarr(i,j,k) = 0.;
	    }
	    else
	    {
	      // set vals outside the domain to
	      sigarr(i,j,k) = BogusValue;
	    }
	  });
	}
    }
}